

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManAreaFlow(Of_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  Gia_Man_t *pGVar7;
  long lVar8;
  long lVar9;
  
  if (p->pGia->pRefs != (int *)0x0) {
    __assert_fail("p->pGia->pRefs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                  ,0xaf,"void Of_ManAreaFlow(Of_Man_t *)");
  }
  Gia_ManCreateRefs(p->pGia);
  p->pObjs->Flow = 0;
  for (iVar6 = 0; pGVar7 = p->pGia, iVar6 < pGVar7->vCis->nSize; iVar6 = iVar6 + 1) {
    pGVar5 = Gia_ManCi(pGVar7,iVar6);
    iVar4 = Gia_ObjId(pGVar7,pGVar5);
    if (iVar4 == 0) break;
    p->pObjs[iVar4].Flow = 0;
  }
  lVar8 = 0x18;
  for (lVar9 = 0; lVar9 < p->pGia->nObjs; lVar9 = lVar9 + 1) {
    pGVar5 = Gia_ManObj(p->pGia,(int)lVar9);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar3 = *(ulong *)pGVar5;
    if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
      uVar1 = pGVar5[-(uVar3 & 0x1fffffff)].Value;
      uVar2 = pGVar5[-(ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff)].Value;
      pGVar7 = p->pGia;
      iVar6 = Gia_ObjId(pGVar7,pGVar5);
      *(uint *)((long)&p->pObjs->iCutH + lVar8) =
           (uVar1 + uVar2 + 1000) / (uint)pGVar7->pRefs[iVar6];
    }
    lVar8 = lVar8 + 0x20;
  }
  iVar6 = 0;
  do {
    pGVar7 = p->pGia;
    if (pGVar7->vCos->nSize <= iVar6) goto LAB_005dbffc;
    pGVar5 = Gia_ManCo(pGVar7,iVar6);
    iVar6 = iVar6 + 1;
  } while (pGVar5 != (Gia_Obj_t *)0x0);
  pGVar7 = p->pGia;
LAB_005dbffc:
  if (pGVar7->pRefs != (int *)0x0) {
    free(pGVar7->pRefs);
    p->pGia->pRefs = (int *)0x0;
  }
  return;
}

Assistant:

void Of_ManAreaFlow( Of_Man_t * p )
{
    int AreaUnit = 1000;
    int i, Id, Total = 0;
    Gia_Obj_t * pObj;
    assert( p->pGia->pRefs == NULL );
    Gia_ManCreateRefs( p->pGia );
    Of_ObjSetFlow( p, 0, 0 );
    Gia_ManForEachCiId( p->pGia, Id, i )
        Of_ObjSetFlow( p, Id, 0 );
    Gia_ManForEachAnd( p->pGia, pObj, Id )
        Of_ObjSetFlow( p, Id, (Gia_ObjFanin0(pObj)->Value + Gia_ObjFanin1(pObj)->Value + AreaUnit) / Gia_ObjRefNum(p->pGia, pObj) );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Total += Gia_ObjFanin0(pObj)->Value;
    ABC_FREE( p->pGia->pRefs );
    if ( 1 )
        return;
    printf( "CI = %5d.  ", Gia_ManCiNum(p->pGia) );
    printf( "CO = %5d.  ", Gia_ManCoNum(p->pGia) );
    printf( "And = %8d.  ", Gia_ManAndNum(p->pGia) );
    printf( "Area = %8d.  ", Total/AreaUnit );
    printf( "\n" );
}